

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

void __thiscall Encoder::RecordInlineeFrame(Encoder *this,Func *inlinee,uint32 currentOffset)

{
  Type *pTVar1;
  int iVar2;
  Type pNVar3;
  code *pcVar4;
  bool bVar5;
  ExecutionMode EVar6;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar7;
  Type *pTVar8;
  InlineeFrameRecord *pIVar9;
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  
  bVar5 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  if (bVar5) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar5 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,InlineInJitLoopBodyPhase,sourceContextId,functionId);
    if (bVar5) {
      return;
    }
  }
  EVar6 = JITTimeWorkItem::GetJitMode(this->m_func->m_workItem);
  if (EVar6 == SimpleJit) {
    return;
  }
  if (inlinee->frameInfo != (InlineeFrameInfo *)0x0) {
    pIVar9 = inlinee->frameInfo->record;
    if (pIVar9 != (InlineeFrameRecord *)0x0) goto LAB_00408954;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x3f9,"(record != nullptr)","record != nullptr");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  pIVar9 = (InlineeFrameRecord *)0x0;
LAB_00408954:
  this_02 = this->m_inlineeFrameMap;
  iVar2 = (this_02->
          super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>)
          .count;
  if (0 < iVar2) {
    pTVar8 = JsUtil::
             List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_02,iVar2 + -1);
    if (pTVar8->record == pIVar9) {
      pTVar8->offset = currentOffset;
      return;
    }
    this_02 = this->m_inlineeFrameMap;
  }
  JsUtil::
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(this_02,0);
  pNVar3 = (this_02->
           super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
           ).buffer;
  iVar2 = (this_02->
          super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>)
          .count;
  pNVar3[iVar2].offset = currentOffset;
  pNVar3[iVar2].record = pIVar9;
  pTVar1 = &(this_02->
            super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
  *pTVar1 = *pTVar1 + 1;
  return;
}

Assistant:

void Encoder::RecordInlineeFrame(Func* inlinee, uint32 currentOffset)
{
    // The only restriction for not supporting loop bodies is that inlinee frame map is created on FunctionEntryPointInfo & not
    // the base class EntryPointInfo.
    if (!(this->m_func->IsLoopBody() && PHASE_OFF(Js::InlineInJitLoopBodyPhase, this->m_func)) && !this->m_func->IsSimpleJit())
    {
        InlineeFrameRecord* record = nullptr;
        if (inlinee->frameInfo)
        {
            record = inlinee->frameInfo->record;
            Assert(record != nullptr);
        }
        if (m_inlineeFrameMap->Count() > 0)
        {
            // update existing record if the entry is the same.
            NativeOffsetInlineeFramePair& lastPair = m_inlineeFrameMap->Item(m_inlineeFrameMap->Count() - 1);

            if (lastPair.record == record)
            {
                lastPair.offset = currentOffset;
                return;
            }
        }
        NativeOffsetInlineeFramePair pair = { currentOffset, record };
        m_inlineeFrameMap->Add(pair);
    }
}